

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::GenerateAccessorDeclarations
          (SingularStringView *this,Printer *p)

{
  FieldDescriptor *pFVar1;
  initializer_list<google::protobuf::io::Printer::Sub> v;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> v_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> v_01;
  undefined8 uVar2;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> in_R9;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes_00;
  Sub *local_2b8;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  undefined1 local_241;
  anon_class_16_2_fd512ddd_for_cb local_240;
  allocator<char> local_229;
  string local_228;
  Sub *local_208;
  Sub local_200;
  iterator local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_138;
  Semantic local_124;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_120;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  basic_string_view<char,_std::char_traits<char>_> *local_108;
  undefined1 local_100 [8];
  FieldDescriptor *local_f8;
  undefined1 local_f0 [32];
  Span<google::protobuf::io::Printer::Sub_const> local_d0 [16];
  undefined1 local_c0 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v2;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> *local_78;
  undefined8 local_70;
  FieldDescriptor *local_68;
  pointer local_60;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_58;
  Span<const_google::protobuf::io::Printer::Sub> local_40;
  undefined1 local_30 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v1;
  Printer *p_local;
  SingularStringView *this_local;
  
  pFVar1 = (this->super_FieldGeneratorBase).field_;
  v1.storage_.callback_buffer_._8_8_ = p;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"");
  local_70 = 1;
  v_01._M_len = 1;
  v_01._M_array = &local_88;
  local_78 = &local_88;
  absl::lts_20250127::Span<std::basic_string_view<char,std::char_traits<char>>const>::
  Span<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>const>
            ((Span<std::basic_string_view<char,std::char_traits<char>>const> *)&local_68,v_01);
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_90);
  prefixes.len_._0_4_ = local_90._M_payload;
  prefixes.len_._4_1_ = local_90._M_engaged;
  prefixes.len_._5_3_ = local_90._5_3_;
  prefixes.ptr_ = local_60;
  AnnotatedAccessors(&local_58,(cpp *)pFVar1,local_68,prefixes,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            ((Span<google::protobuf::io::Printer::Sub_const> *)&local_40,&local_58);
  io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_30,p,local_40);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_58);
  uVar2 = v1.storage_.callback_buffer_._8_8_;
  pFVar1 = (this->super_FieldGeneratorBase).field_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_118,"set_");
  local_100 = (undefined1  [8])0x1;
  v_00._M_len = 1;
  v_00._M_array = &local_118;
  local_108 = &local_118;
  absl::lts_20250127::Span<std::basic_string_view<char,std::char_traits<char>>const>::
  Span<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>const>
            ((Span<std::basic_string_view<char,std::char_traits<char>>const> *)&local_f8,v_00);
  local_124 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_120,&local_124);
  prefixes_00.len_ =
       (size_type)
       local_120.
       super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>.
       _M_payload.super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>;
  prefixes_00.ptr_ = (pointer)local_f0._0_8_;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)(local_f0 + 8),(cpp *)pFVar1,local_f8,prefixes_00,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            (local_d0,(vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                       *)(local_f0 + 8));
  io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_c0,(Printer *)uVar2,(Span<const_google::protobuf::io::Printer::Sub>)local_d0);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)(local_f0 + 8));
  uVar2 = v1.storage_.callback_buffer_._8_8_;
  local_241 = 1;
  local_208 = &local_200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"donated",&local_229);
  local_240.p = (Printer **)(v1.storage_.callback_buffer_ + 8);
  local_240.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::SingularStringView::GenerateAccessorDeclarations(google::protobuf::io::Printer*)const::__0>
            (&local_200,&local_228,&local_240);
  local_241 = 0;
  local_148 = &local_200;
  local_140 = 1;
  v._M_len = 1;
  v._M_array = local_148;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_138._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_258,
             "\n            $DEPRECATED$ ::absl::string_view $name$() const;\n            template <typename Arg_ = ::std::string&&>\n            $DEPRECATED$ void $set_name$(Arg_&& arg);\n\n            private:\n            ::absl::string_view _internal_$name$() const;\n            PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(::absl::string_view value);\n            $donated$;\n\n            public:\n          "
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)uVar2,local_138._M_allocated_capacity,local_138._8_8_,
                    local_258._M_len,local_258._M_str);
  local_2b8 = (Sub *)&local_148;
  do {
    local_2b8 = local_2b8 + -1;
    io::Printer::Sub::~Sub(local_2b8);
  } while (local_2b8 != &local_200);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_c0);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_30);
  return;
}

Assistant:

void SingularStringView::GenerateAccessorDeclarations(io::Printer* p) const {
  auto v1 = p->WithVars(AnnotatedAccessors(field_, {""}));
  auto v2 = p->WithVars(
      AnnotatedAccessors(field_, {"set_"}, AnnotationCollector::kSet));

  p->Emit({{"donated",
            [&] {
              if (!is_inlined()) return;
              p->Emit(R"cc(
                PROTOBUF_ALWAYS_INLINE bool _internal_$name$_donated() const;
              )cc");
            }}},
          R"cc(
            $DEPRECATED$ ::absl::string_view $name$() const;
            template <typename Arg_ = ::std::string&&>
            $DEPRECATED$ void $set_name$(Arg_&& arg);

            private:
            ::absl::string_view _internal_$name$() const;
            PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(::absl::string_view value);
            $donated$;

            public:
          )cc");
}